

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_alloc(size_t n)

{
  void *pvVar1;
  long *local_20;
  inform_dist *dist;
  size_t n_local;
  
  if (n == 0) {
    n_local = 0;
  }
  else {
    local_20 = (long *)malloc(0x18);
    if (local_20 != (long *)0x0) {
      pvVar1 = calloc(n,4);
      *local_20 = (long)pvVar1;
      if (*local_20 == 0) {
        free(local_20);
        local_20 = (long *)0x0;
      }
      else {
        local_20[1] = n;
        local_20[2] = 0;
      }
    }
    n_local = (size_t)local_20;
  }
  return (inform_dist *)n_local;
}

Assistant:

inform_dist* inform_dist_alloc(size_t n)
{
    // if the requested support size is zero, return NULL
    if (n == 0)
    {
        return NULL;
    }
    // allocate the distribution
    inform_dist *dist = malloc(sizeof(inform_dist));
    // if the allocation succeeded
    if (dist != NULL)
    {
        // allocate the underlying histogram
        dist->histogram = calloc(n, sizeof(uint32_t));
        // if the allocation succeeded
        if (dist->histogram != NULL)
        {
            // set the distribution size and counts
            dist->size   = n;
            dist->counts = 0;
        }
        // otherwise free the distribution
        else
        {
            free(dist);
            dist = NULL;
        }
    }
    // return the (potentially NULL) distribution
    return dist;
}